

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seq.c
# Opt level: O3

void * coll_seq_insert_after(coll_seq_t *seq,void *data,void *pos)

{
  coll_seq_node_t *pcVar1;
  coll_seq_node_t *pcVar2;
  
  if (seq != (coll_seq_t *)0x0) {
    for (pcVar1 = seq->head; pcVar1 != (coll_seq_node_t *)0x0; pcVar1 = pcVar1->next) {
      if (pcVar1->data == pos) {
        pcVar2 = (coll_seq_node_t *)malloc(0x10);
        pcVar2->data = data;
        pcVar2->next = pcVar1->next;
        pcVar1->next = pcVar2;
        seq->len = seq->len + 1;
        return data;
      }
    }
  }
  return (void *)0x0;
}

Assistant:

void *coll_seq_insert_after(coll_seq_t *seq, void *data, void *pos) {
    if (!seq) {
        return NULL;
    }
    node_t *cur = seq->head;
    while (cur) {
        if (cur->data == pos) {
            node_t *node = malloc(sizeof(node_t));
            node->data = data;
            node->next = cur->next;
            cur->next = node;
            ++(seq->len);
            return data;
        }
        cur = cur->next;
    }
    return NULL;
}